

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AC3DImporter::InternReadFile
          (AC3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  pointer *this_00;
  pointer *this_01;
  pointer *this_02;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  IOStream *__p;
  pointer pIVar4;
  DeadlyImportError *pDVar5;
  reference pvVar6;
  Logger *pLVar7;
  basic_formatter *this_03;
  char *pcVar8;
  size_type sVar9;
  Object *pOVar10;
  aiNode *paVar11;
  aiMesh **ppaVar12;
  reference __src;
  aiMaterial **ppaVar13;
  reference __src_00;
  ulong uVar14;
  aiLight **ppaVar15;
  reference __src_01;
  int iVar16;
  allocator<char> local_481;
  string local_480;
  Object *local_460;
  Object *root;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> omaterials;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  allocator<char> local_3c9;
  string local_3c8;
  uint local_3a4;
  uint local_3a0;
  uint i_5;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  char *local_368;
  char *sz;
  string local_358;
  reference local_338;
  Material *mat;
  undefined1 local_2d8 [8];
  vector<aiLight_*,_std::allocator<aiLight_*>_> lights;
  vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> rootObjects;
  vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> materials;
  string local_118;
  char local_f3 [3];
  uint local_f0;
  char msg [3];
  uint version;
  undefined1 local_c8 [8];
  vector<char,_std::allocator<char>_> mBuffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  AC3DImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar4 == (pointer)0x0) {
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open AC3D file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar5,&local_88);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_c8);
  pIVar4 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer
            (pIVar4,(vector<char,_std::allocator<char>_> *)local_c8,FORBID_EMPTY);
  pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_c8,0);
  this->buffer = pvVar6;
  this->mNumMeshes = 0;
  this->groups = 0;
  this->worlds = 0;
  this->polys = 0;
  this->lights = 0;
  iVar3 = strncmp(this->buffer,"AC3D",4);
  if (iVar3 != 0) {
    msg[1] = '\x01';
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&version,"AC3D: No valid AC3D file, magic sequence not found",
               (allocator<char> *)(msg + 2));
    DeadlyImportError::DeadlyImportError(pDVar5,(string *)&version);
    msg[1] = '\0';
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_f0 = HexDigitToDecimal(this->buffer[4]);
  ASSIMP_itoa10(local_f3,3,local_f0);
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[27]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &materials.
              super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (char (*) [27])"AC3D file format version: ");
  this_03 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                       &materials.
                        super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_f3);
  Formatter::basic_formatter::operator_cast_to_string(&local_118,this_03);
  Logger::info(pLVar7,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &materials.
              super__Vector_base<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_00 = &rootObjects.
             super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  vector((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *)
         this_00);
  std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
  reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_> *
          )this_00,5);
  this_01 = &lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::vector
            ((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *)
             this_01);
  std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::reserve
            ((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_> *)
             this_01,5);
  std::vector<aiLight_*,_std::allocator<aiLight_*>_>::vector
            ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
  this->mLights = (vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8;
LAB_005f79b6:
  do {
    while( true ) {
      bVar2 = GetNextLine(this);
      if (!bVar2) {
        bVar2 = std::
                vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                ::empty((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                         *)&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage);
        if ((bVar2) || (this->mNumMeshes == 0)) {
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3c8,"AC3D: No meshes have been loaded",&local_3c9);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_3c8);
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        bVar2 = std::
                vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                ::empty((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                         *)&rootObjects.
                            super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          pLVar7 = DefaultLogger::get();
          Logger::warn(pLVar7,"AC3D: No material has been found");
          Material::Material((Material *)
                             &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage);
          std::
          vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
          push_back((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                     *)&rootObjects.
                        super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (value_type *)
                    &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          Material::~Material((Material *)
                              &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        this->mNumMeshes = (this->mNumMeshes >> 2) + 1 + this->mNumMeshes;
        this_02 = &omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_02);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)this_02,(ulong)this->mNumMeshes);
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::vector
                  ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&root);
        std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ::reserve((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                   *)&rootObjects.
                      super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)this->mNumMeshes);
        sVar9 = std::
                vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                ::size((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                        *)&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        if (sVar9 == 1) {
          local_460 = std::
                      vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                      ::operator[]((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                    *)&lights.
                                       super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,0);
        }
        else {
          pOVar10 = (Object *)operator_new(0xe0);
          Object::Object(pOVar10);
          local_460 = pOVar10;
        }
        paVar11 = ConvertObjectSection
                            (this,local_460,
                             (vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                             &omaterials.
                              super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&root,
                             (vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                              *)&rootObjects.
                                 super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(aiNode *)0x0);
        pScene->mRootNode = paVar11;
        sVar9 = std::
                vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                ::size((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                        *)&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
        pOVar10 = local_460;
        if ((sVar9 != 1) && (local_460 != (Object *)0x0)) {
          Object::~Object(local_460);
          operator_delete(pOVar10,0xe0);
        }
        iVar3 = strncmp((pScene->mRootNode->mName).data,"Node",4);
        if (iVar3 == 0) {
          aiString::Set(&pScene->mRootNode->mName,"<AC3DWorld>");
        }
        bVar2 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                           &omaterials.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (bVar2) {
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_480,"An unknown error occurred during converting",&local_481);
          DeadlyImportError::DeadlyImportError(pDVar5,&local_480);
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        sVar9 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                           &omaterials.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        pScene->mNumMeshes = (uint)sVar9;
        ppaVar12 = (aiMesh **)operator_new__((ulong)pScene->mNumMeshes << 3);
        pScene->mMeshes = ppaVar12;
        ppaVar12 = pScene->mMeshes;
        __src = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::operator[]
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                           &omaterials.
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
        memcpy(ppaVar12,__src,(ulong)pScene->mNumMeshes << 3);
        sVar9 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size
                          ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&root);
        pScene->mNumMaterials = (uint)sVar9;
        ppaVar13 = (aiMaterial **)operator_new__((ulong)pScene->mNumMaterials << 3);
        pScene->mMaterials = ppaVar13;
        ppaVar13 = pScene->mMaterials;
        __src_00 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                             ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&root,0);
        memcpy(ppaVar13,__src_00,(ulong)pScene->mNumMaterials << 3);
        sVar9 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                          ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
        pScene->mNumLights = (uint)sVar9;
        sVar9 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                          ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
        if (sVar9 != 0) {
          sVar9 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                            ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = sVar9;
          uVar14 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar14 = 0xffffffffffffffff;
          }
          ppaVar15 = (aiLight **)operator_new__(uVar14);
          pScene->mLights = ppaVar15;
          ppaVar15 = pScene->mLights;
          __src_01 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::operator[]
                               ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8,0);
          sVar9 = std::vector<aiLight_*,_std::allocator<aiLight_*>_>::size
                            ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
          memcpy(ppaVar15,__src_01,sVar9 << 3);
        }
        std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::~vector
                  ((vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *)&root);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   &omaterials.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<aiLight_*,_std::allocator<aiLight_*>_>::~vector
                  ((vector<aiLight_*,_std::allocator<aiLight_*>_> *)local_2d8);
        std::vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>::
        ~vector((vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                 *)&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
        ::~vector((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                   *)&rootObjects.
                      super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_c8);
        std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
                  (&local_30);
        return;
      }
      bVar2 = TokenMatch<char_const>(&this->buffer,"MATERIAL",8);
      if (bVar2) break;
LAB_005f8730:
      LoadObjectSection(this,(vector<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                              *)&lights.super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    Material::Material((Material *)&mat);
    std::vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>::
    push_back((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
               *)&rootObjects.
                  super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&mat);
    Material::~Material((Material *)&mat);
    local_338 = std::
                vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                ::back((vector<Assimp::AC3DImporter::Material,_std::allocator<Assimp::AC3DImporter::Material>_>
                        *)&rootObjects.
                           super__Vector_base<Assimp::AC3DImporter::Object,_std::allocator<Assimp::AC3DImporter::Object>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = SkipSpaces<char>(&this->buffer);
    if (bVar2) {
      if (*this->buffer == '\"') {
        if (*this->buffer == '\0') {
          sz._6_1_ = 1;
          pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_358,"AC3D: Unexpected EOF in string",
                     (allocator<char> *)((long)&sz + 7));
          DeadlyImportError::DeadlyImportError(pDVar5,&local_358);
          sz._6_1_ = 0;
          __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        this->buffer = this->buffer + 1;
        local_368 = this->buffer;
        while (*this->buffer != '\"') {
          bVar2 = IsLineEnd<char>(*this->buffer);
          if (bVar2) {
            pLVar7 = DefaultLogger::get();
            Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL in string");
            std::__cxx11::string::operator=((string *)&local_338->name,"ERROR");
            break;
          }
          this->buffer = this->buffer + 1;
        }
        bVar2 = IsLineEnd<char>(*this->buffer);
        pcVar8 = local_368;
        if (bVar2) goto LAB_005f79b6;
        iVar3 = *(int *)&this->buffer;
        iVar16 = (int)local_368;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&i,pcVar8,(ulong)(uint)(iVar3 - iVar16),(allocator *)((long)&i_1 + 3));
        std::__cxx11::string::operator=((string *)&local_338->name,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
        std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
        this->buffer = this->buffer + 1;
        bVar2 = SkipSpaces<char>(&this->buffer);
        if (!bVar2) {
          pLVar7 = DefaultLogger::get();
          Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
          goto LAB_005f79b6;
        }
      }
      bVar2 = SkipSpaces<char>(&this->buffer);
      if (bVar2) {
        iVar3 = strncmp(this->buffer,"rgb",3);
        if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[3]), bVar2)) {
          this->buffer = this->buffer + 4;
          for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
            bVar2 = SkipSpaces<char>(&this->buffer);
            if (bVar2) {
              pcVar8 = fast_atoreal_move<float>(this->buffer,&(local_338->rgb).r + i_2,true);
              this->buffer = pcVar8;
            }
            else {
              pLVar7 = DefaultLogger::get();
              Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
            }
          }
          bVar2 = SkipSpaces<char>(&this->buffer);
          if (bVar2) {
            iVar3 = strncmp(this->buffer,"amb",3);
            if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[3]), bVar2)) {
              this->buffer = this->buffer + 4;
              for (i_3 = 0; i_3 < 3; i_3 = i_3 + 1) {
                bVar2 = SkipSpaces<char>(&this->buffer);
                if (bVar2) {
                  pcVar8 = fast_atoreal_move<float>(this->buffer,&(local_338->amb).r + i_3,true);
                  this->buffer = pcVar8;
                }
                else {
                  pLVar7 = DefaultLogger::get();
                  Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                }
              }
              bVar2 = SkipSpaces<char>(&this->buffer);
              if (bVar2) {
                iVar3 = strncmp(this->buffer,"emis",4);
                if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[4]), bVar2)) {
                  this->buffer = this->buffer + 5;
                  for (i_4 = 0; i_4 < 3; i_4 = i_4 + 1) {
                    bVar2 = SkipSpaces<char>(&this->buffer);
                    if (bVar2) {
                      pcVar8 = fast_atoreal_move<float>
                                         (this->buffer,&(local_338->emis).r + i_4,true);
                      this->buffer = pcVar8;
                    }
                    else {
                      pLVar7 = DefaultLogger::get();
                      Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                    }
                  }
                  bVar2 = SkipSpaces<char>(&this->buffer);
                  if (bVar2) {
                    iVar3 = strncmp(this->buffer,"spec",4);
                    if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[4]), bVar2)) {
                      this->buffer = this->buffer + 5;
                      for (i_5 = 0; i_5 < 3; i_5 = i_5 + 1) {
                        bVar2 = SkipSpaces<char>(&this->buffer);
                        if (bVar2) {
                          pcVar8 = fast_atoreal_move<float>
                                             (this->buffer,&(local_338->spec).r + i_5,true);
                          this->buffer = pcVar8;
                        }
                        else {
                          pLVar7 = DefaultLogger::get();
                          Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                        }
                      }
                      bVar2 = SkipSpaces<char>(&this->buffer);
                      if (bVar2) {
                        iVar3 = strncmp(this->buffer,"shi",3);
                        if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[3]), bVar2)) {
                          this->buffer = this->buffer + 4;
                          for (local_3a0 = 0; local_3a0 == 0; local_3a0 = local_3a0 + 1) {
                            bVar2 = SkipSpaces<char>(&this->buffer);
                            if (bVar2) {
                              pcVar8 = fast_atoreal_move<float>
                                                 (this->buffer,&local_338->shin + local_3a0,true);
                              this->buffer = pcVar8;
                            }
                            else {
                              pLVar7 = DefaultLogger::get();
                              Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                            }
                          }
                          bVar2 = SkipSpaces<char>(&this->buffer);
                          if (bVar2) {
                            iVar3 = strncmp(this->buffer,"trans",5);
                            if ((iVar3 == 0) && (bVar2 = IsSpace<char>(this->buffer[5]), bVar2)) {
                              this->buffer = this->buffer + 6;
                              for (local_3a4 = 0; local_3a4 == 0; local_3a4 = local_3a4 + 1) {
                                bVar2 = SkipSpaces<char>(&this->buffer);
                                if (bVar2) {
                                  pcVar8 = fast_atoreal_move<float>
                                                     (this->buffer,&local_338->trans + local_3a4,
                                                      true);
                                  this->buffer = pcVar8;
                                }
                                else {
                                  pLVar7 = DefaultLogger::get();
                                  Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                                }
                              }
                              goto LAB_005f8730;
                            }
                            pLVar7 = DefaultLogger::get();
                            Logger::error(pLVar7,"AC3D: Unexpexted token. trans was expected.");
                          }
                          else {
                            pLVar7 = DefaultLogger::get();
                            Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                          }
                        }
                        else {
                          pLVar7 = DefaultLogger::get();
                          Logger::error(pLVar7,"AC3D: Unexpexted token. shi was expected.");
                        }
                      }
                      else {
                        pLVar7 = DefaultLogger::get();
                        Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                      }
                    }
                    else {
                      pLVar7 = DefaultLogger::get();
                      Logger::error(pLVar7,"AC3D: Unexpexted token. spec was expected.");
                    }
                  }
                  else {
                    pLVar7 = DefaultLogger::get();
                    Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
                  }
                }
                else {
                  pLVar7 = DefaultLogger::get();
                  Logger::error(pLVar7,"AC3D: Unexpexted token. emis was expected.");
                }
              }
              else {
                pLVar7 = DefaultLogger::get();
                Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
              }
            }
            else {
              pLVar7 = DefaultLogger::get();
              Logger::error(pLVar7,"AC3D: Unexpexted token. amb was expected.");
            }
          }
          else {
            pLVar7 = DefaultLogger::get();
            Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
          }
        }
        else {
          pLVar7 = DefaultLogger::get();
          Logger::error(pLVar7,"AC3D: Unexpexted token. rgb was expected.");
        }
      }
      else {
        pLVar7 = DefaultLogger::get();
        Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
      }
      goto LAB_005f79b6;
    }
    pLVar7 = DefaultLogger::get();
    Logger::error(pLVar7,"AC3D: Unexpected EOF/EOL");
  } while( true );
}

Assistant:

void AC3DImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open AC3D file " + pFile + ".");

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);

    buffer = &mBuffer2[0];
    mNumMeshes = 0;

    lights = polys = worlds = groups = 0;

    if (::strncmp(buffer,"AC3D",4)) {
        throw DeadlyImportError("AC3D: No valid AC3D file, magic sequence not found");
    }

    // print the file format version to the console
    unsigned int version = HexDigitToDecimal( buffer[4] );
    char msg[3];
    ASSIMP_itoa10(msg,3,version);
    ASSIMP_LOG_INFO_F("AC3D file format version: ", msg);

    std::vector<Material> materials;
    materials.reserve(5);

    std::vector<Object> rootObjects;
    rootObjects.reserve(5);

    std::vector<aiLight*> lights;
    mLights = & lights;

    while (GetNextLine())
    {
        if (TokenMatch(buffer,"MATERIAL",8))
        {
            materials.push_back(Material());
            Material& mat = materials.back();

            // manually parse the material ... sscanf would use the buldin atof ...
            // Format: (name) rgb %f %f %f  amb %f %f %f  emis %f %f %f  spec %f %f %f  shi %d  trans %f

            AI_AC_SKIP_TO_NEXT_TOKEN();
            if ('\"' == *buffer)
            {
                AI_AC_GET_STRING(mat.name);
                AI_AC_SKIP_TO_NEXT_TOKEN();
            }

            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("rgb",3,3,&mat.rgb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("amb",3,3,&mat.amb);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("emis",4,3,&mat.emis);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("spec",4,3,&mat.spec);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("shi",3,1,&mat.shin);
            AI_AC_CHECKED_LOAD_FLOAT_ARRAY("trans",5,1,&mat.trans);
        }
        LoadObjectSection(rootObjects);
    }

    if (rootObjects.empty() || !mNumMeshes)
    {
        throw DeadlyImportError("AC3D: No meshes have been loaded");
    }
    if (materials.empty())
    {
        ASSIMP_LOG_WARN("AC3D: No material has been found");
        materials.push_back(Material());
    }

    mNumMeshes += (mNumMeshes>>2u) + 1;
    std::vector<aiMesh*> meshes;
    meshes.reserve(mNumMeshes);

    std::vector<aiMaterial*> omaterials;
    materials.reserve(mNumMeshes);

    // generate a dummy root if there are multiple objects on the top layer
    Object* root;
    if (1 == rootObjects.size())
        root = &rootObjects[0];
    else
    {
        root = new Object();
    }

    // now convert the imported stuff to our output data structure
    pScene->mRootNode = ConvertObjectSection(*root,meshes,omaterials,materials);
    if (1 != rootObjects.size())delete root;

    if (!::strncmp( pScene->mRootNode->mName.data, "Node", 4))
        pScene->mRootNode->mName.Set("<AC3DWorld>");

    // copy meshes
    if (meshes.empty())
    {
        throw DeadlyImportError("An unknown error occurred during converting");
    }
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    ::memcpy(pScene->mMeshes,&meshes[0],pScene->mNumMeshes*sizeof(void*));

    // copy materials
    pScene->mNumMaterials = (unsigned int)omaterials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&omaterials[0],pScene->mNumMaterials*sizeof(void*));

    // copy lights
    pScene->mNumLights = (unsigned int)lights.size();
    if (lights.size())
    {
        pScene->mLights = new aiLight*[lights.size()];
        ::memcpy(pScene->mLights,&lights[0],lights.size()*sizeof(void*));
    }
}